

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

void cf_he_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  long lVar2;
  eyeballer *baller;
  size_t i;
  cf_he_ctx *ctx;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    for (baller = (eyeballer *)0x0; baller < (eyeballer *)0x2;
        baller = (eyeballer *)((long)&baller->name + 1)) {
      lVar2 = *(long *)((long)pvVar1 + (long)baller * 8 + 0x20);
      if ((lVar2 != 0) && (*(long *)(lVar2 + 0x28) != 0)) {
        Curl_conn_cf_adjust_pollset(*(Curl_cfilter **)(lVar2 + 0x28),data,ps);
      }
    }
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
    }
  }
  return;
}

Assistant:

static void cf_he_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(!cf->connected) {
    for(i = 0; i < CURL_ARRAYSIZE(ctx->baller); i++) {
      struct eyeballer *baller = ctx->baller[i];
      if(!baller || !baller->cf)
        continue;
      Curl_conn_cf_adjust_pollset(baller->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}